

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O1

HyperParam * xLearn::Init(void)

{
  HyperParam *in_RDI;
  
  HyperParam::HyperParam(in_RDI);
  std::__cxx11::string::_M_replace
            ((ulong)&in_RDI->score_func,0,(char *)(in_RDI->score_func)._M_string_length,0x14161a);
  std::__cxx11::string::_M_replace
            ((ulong)&in_RDI->loss_func,0,(char *)(in_RDI->loss_func)._M_string_length,0x141272);
  in_RDI->num_feature = 4;
  in_RDI->num_K = 4;
  in_RDI->num_field = 4;
  in_RDI->auxiliary_size = 2;
  std::__cxx11::string::_M_replace
            ((ulong)&in_RDI->model_file,0,(char *)(in_RDI->model_file)._M_string_length,0x14127a);
  return in_RDI;
}

Assistant:

HyperParam Init() {
  HyperParam hyper_param;
  hyper_param.score_func = "ffm";
  hyper_param.loss_func = "squared";
  hyper_param.num_feature = 4;
  hyper_param.num_K = 4;
  hyper_param.auxiliary_size = 2;
  hyper_param.num_field = 4;
  hyper_param.model_file = "./test_model.bin";
  return hyper_param;
}